

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_to_dfa.cpp
# Opt level: O0

DFA * __thiscall
RegexToDFAConverter::convert(DFA *__return_storage_ptr__,RegexToDFAConverter *this,string *expr)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  SyntaxTreeNode *this_00;
  reference pvVar4;
  iterator iVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  size_type sVar8;
  reference pvVar9;
  reference this_01;
  reference piVar10;
  reference ppVar11;
  reference piVar12;
  reference pvVar13;
  const_iterator cStack_220;
  int state;
  const_iterator __end2;
  const_iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  pair<const_std::vector<int,_std::allocator<int>_>,_int> it_2;
  iterator __end1_1;
  iterator __begin1_1;
  map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
  *__range1_1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1b0;
  const_iterator local_1a8;
  int *local_1a0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_198;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_190;
  const_iterator local_188;
  int *local_180;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_178;
  undefined4 local_170;
  int local_16c;
  _Node_iterator_base<int,_false> _Stack_168;
  int it_1;
  iterator __end4;
  iterator __begin4;
  value_type *__range4;
  vector<int,_std::allocator<int>_> next;
  int j;
  int i;
  value_type curr_state;
  int num_states;
  int local_f4;
  _Node_iterator_base<int,_false> _Stack_f0;
  int it;
  iterator __end1;
  iterator __begin1;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *__range1;
  pointer piStack_d0;
  pointer local_c8;
  undefined1 local_b8 [8];
  queue<std::vector<int,_std::allocator<int>_>,_std::deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  que;
  anon_class_8_1_8991fb9c comp;
  SyntaxTreeNode *syntax_tree_root;
  undefined1 local_40 [4];
  int curr_pos;
  string simplified_expr;
  string *expr_local;
  RegexToDFAConverter *this_local;
  DFA *res;
  
  simplify((RegexToDFAConverter *)local_40,(string *)this);
  syntax_tree_root._4_4_ = 0;
  this->leaves_count_ = 0;
  std::
  vector<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::allocator<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>_>_>
  ::clear(&this->follow_pos_);
  std::vector<char,_std::allocator<char>_>::clear(&this->what_letter_);
  this_00 = expression_eval(this,(string *)local_40,(int *)((long)&syntax_tree_root + 4));
  que.c.
  super__Deque_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)this;
  std::
  queue<std::vector<int,std::allocator<int>>,std::deque<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>
  ::
  queue<std::deque<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,void>
            ((queue<std::vector<int,std::allocator<int>>,std::deque<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>
              *)local_b8);
  __range1 = (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)0x0;
  piStack_d0 = (pointer)0x0;
  local_c8 = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&__range1);
  std::
  queue<std::vector<int,_std::allocator<int>_>,_std::deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  ::push((queue<std::vector<int,_std::allocator<int>_>,_std::deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
          *)local_b8,(vector<int,_std::allocator<int>_> *)&__range1);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&__range1);
  __end1 = std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::begin
                     (&this_00->first_pos);
  _Stack_f0._M_cur =
       (__node_type *)
       std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::end
                 (&this_00->first_pos);
  while (bVar2 = std::__detail::operator!=
                           (&__end1.super__Node_iterator_base<int,_false>,&stack0xffffffffffffff10),
        bVar2) {
    piVar10 = std::__detail::_Node_iterator<int,_true,_false>::operator*(&__end1);
    local_f4 = *piVar10;
    pvVar4 = std::
             queue<std::vector<int,_std::allocator<int>_>,_std::deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
             ::front((queue<std::vector<int,_std::allocator<int>_>,_std::deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                      *)local_b8);
    std::vector<int,_std::allocator<int>_>::push_back(pvVar4,&local_f4);
    std::__detail::_Node_iterator<int,_true,_false>::operator++(&__end1);
  }
  pvVar4 = std::
           queue<std::vector<int,_std::allocator<int>_>,_std::deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
           ::front((queue<std::vector<int,_std::allocator<int>_>,_std::deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                    *)local_b8);
  iVar5 = std::vector<int,_std::allocator<int>_>::begin(pvVar4);
  pvVar4 = std::
           queue<std::vector<int,_std::allocator<int>_>,_std::deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
           ::front((queue<std::vector<int,_std::allocator<int>_>,_std::deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                    *)local_b8);
  iVar6 = std::vector<int,_std::allocator<int>_>::end(pvVar4);
  std::
  sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,RegexToDFAConverter::convert(std::__cxx11::string_const&)::__0>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar5._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar6._M_current,
             (anon_class_8_1_8991fb9c)
             que.c.
             super__Deque_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node);
  std::
  map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ::clear(&this->mark_);
  curr_state.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  curr_state.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._3_1_ = 0;
  DFA::DFA(__return_storage_ptr__);
  iVar3 = curr_state.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ + 1;
  curr_state.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = iVar3;
  pvVar4 = std::
           queue<std::vector<int,_std::allocator<int>_>,_std::deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
           ::front((queue<std::vector<int,_std::allocator<int>_>,_std::deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                    *)local_b8);
  pmVar7 = std::
           map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
           ::operator[](&this->mark_,pvVar4);
  *pmVar7 = iVar3;
  DFA::add_node(__return_storage_ptr__,
                curr_state.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_);
  DFA::set_initial(__return_storage_ptr__,
                   curr_state.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_);
  if (this_00 != (SyntaxTreeNode *)0x0) {
    SyntaxTreeNode::~SyntaxTreeNode(this_00);
    operator_delete(this_00);
  }
  while (bVar2 = std::
                 queue<std::vector<int,_std::allocator<int>_>,_std::deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                 ::empty((queue<std::vector<int,_std::allocator<int>_>,_std::deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                          *)local_b8), ((bVar2 ^ 0xffU) & 1) != 0) {
    pvVar4 = std::
             queue<std::vector<int,_std::allocator<int>_>,_std::deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
             ::front((queue<std::vector<int,_std::allocator<int>_>,_std::deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                      *)local_b8);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&j,pvVar4);
    std::
    queue<std::vector<int,_std::allocator<int>_>,_std::deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
    ::pop((queue<std::vector<int,_std::allocator<int>_>,_std::deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
           *)local_b8);
    next.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 0;
    while (iVar3 = next.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_,
          sVar8 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)&j), iVar3 < (int)sVar8) {
      next.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ =
           next.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_;
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&__range4)
      ;
      while( true ) {
        iVar3 = (int)next.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
        sVar8 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)&j);
        bVar2 = false;
        if (iVar3 < (int)sVar8) {
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&j,
                              (long)next.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage._4_4_);
          pvVar13 = std::vector<char,_std::allocator<char>_>::operator[]
                              (&this->what_letter_,(long)*pvVar9);
          cVar1 = *pvVar13;
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&j,
                              (long)(int)next.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_end_of_storage);
          pvVar13 = std::vector<char,_std::allocator<char>_>::operator[]
                              (&this->what_letter_,(long)*pvVar9);
          bVar2 = cVar1 == *pvVar13;
        }
        if (!bVar2) break;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&j,
                            (long)(int)next.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage);
        this_01 = std::
                  vector<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::allocator<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>_>_>
                  ::operator[](&this->follow_pos_,(long)*pvVar9);
        __end4 = std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
                 begin(this_01);
        _Stack_168._M_cur =
             (__node_type *)
             std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::end
                       (this_01);
        while (bVar2 = std::__detail::operator!=
                                 (&__end4.super__Node_iterator_base<int,_false>,
                                  &stack0xfffffffffffffe98), bVar2) {
          piVar10 = std::__detail::_Node_iterator<int,_true,_false>::operator*(&__end4);
          local_16c = *piVar10;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)&__range4,&local_16c);
          std::__detail::_Node_iterator<int,_true,_false>::operator++(&__end4);
        }
        next.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ =
             (int)next.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                  ._M_end_of_storage + 1;
      }
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&j,
                          (long)next.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage._4_4_);
      pvVar13 = std::vector<char,_std::allocator<char>_>::operator[]
                          (&this->what_letter_,(long)*pvVar9);
      if (*pvVar13 == '#') {
        local_170 = 6;
      }
      else {
        local_178._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)&__range4);
        local_180 = (int *)std::vector<int,_std::allocator<int>_>::end
                                     ((vector<int,_std::allocator<int>_> *)&__range4);
        std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  (local_178,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_180);
        local_198._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)&__range4);
        local_1a0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                     ((vector<int,_std::allocator<int>_> *)&__range4);
        local_190 = std::
                    unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                              (local_198,
                               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                               local_1a0);
        __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
        __normal_iterator<int*>
                  ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_188,
                   &local_190);
        local_1b0._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)&__range4);
        __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
        __normal_iterator<int*>
                  ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_1a8,
                   &local_1b0);
        std::vector<int,_std::allocator<int>_>::erase
                  ((vector<int,_std::allocator<int>_> *)&__range4,local_188,local_1a8);
        iVar5 = std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)&__range4);
        iVar6 = std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)&__range4);
        std::
        sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,RegexToDFAConverter::convert(std::__cxx11::string_const&)::__0>
                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   iVar5._M_current,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   iVar6._M_current,
                   (anon_class_8_1_8991fb9c)
                   que.c.
                   super__Deque_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node);
        pmVar7 = std::
                 map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                 ::operator[](&this->mark_,(key_type *)&__range4);
        if (*pmVar7 == 0) {
          iVar3 = curr_state.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
          curr_state.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ = iVar3;
          pmVar7 = std::
                   map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                   ::operator[](&this->mark_,(key_type *)&__range4);
          *pmVar7 = iVar3;
          DFA::add_node(__return_storage_ptr__,
                        curr_state.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_);
          std::
          queue<std::vector<int,_std::allocator<int>_>,_std::deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
          ::push((queue<std::vector<int,_std::allocator<int>_>,_std::deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                  *)local_b8,(value_type *)&__range4);
        }
        pmVar7 = std::
                 map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                 ::operator[](&this->mark_,(key_type *)&j);
        iVar3 = *pmVar7;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&j,
                            (long)next.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage._4_4_);
        pvVar13 = std::vector<char,_std::allocator<char>_>::operator[]
                            (&this->what_letter_,(long)*pvVar9);
        cVar1 = *pvVar13;
        pmVar7 = std::
                 map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                 ::operator[](&this->mark_,(key_type *)&__range4);
        DFA::add_transition(__return_storage_ptr__,iVar3,cVar1,*pmVar7);
        local_170 = 0;
      }
      next.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           (int)next.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage;
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)&__range4);
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&j);
  }
  __end1_1 = std::
             map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
             ::begin(&this->mark_);
  it_2._24_8_ = std::
                map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                ::end(&this->mark_);
  do {
    bVar2 = std::operator!=(&__end1_1,(_Self *)&it_2.second);
    if (!bVar2) {
      curr_state.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._3_1_ = 1;
      local_170 = 1;
      std::
      queue<std::vector<int,_std::allocator<int>_>,_std::deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
      ::~queue((queue<std::vector<int,_std::allocator<int>_>,_std::deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                *)local_b8);
      std::__cxx11::string::~string((string *)local_40);
      return __return_storage_ptr__;
    }
    ppVar11 = std::_Rb_tree_iterator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>
              ::operator*(&__end1_1);
    std::pair<const_std::vector<int,_std::allocator<int>_>,_int>::pair
              ((pair<const_std::vector<int,_std::allocator<int>_>,_int> *)&__range2,ppVar11);
    __end2 = std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)&__range2);
    cStack_220 = std::vector<int,_std::allocator<int>_>::end
                           ((vector<int,_std::allocator<int>_> *)&__range2);
    while (bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffde0), bVar2) {
      piVar12 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&__end2);
      pvVar13 = std::vector<char,_std::allocator<char>_>::operator[]
                          (&this->what_letter_,(long)*piVar12);
      if (*pvVar13 == '#') {
        DFA::add_final(__return_storage_ptr__,
                       (int)it_2.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
        break;
      }
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
    std::pair<const_std::vector<int,_std::allocator<int>_>,_int>::~pair
              ((pair<const_std::vector<int,_std::allocator<int>_>,_int> *)&__range2);
    std::_Rb_tree_iterator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>::
    operator++(&__end1_1);
  } while( true );
}

Assistant:

DFA RegexToDFAConverter::convert(const string &expr) {
  string simplified_expr = simplify(expr);

  //evaluate expression
  int curr_pos = 0;
  leaves_count_ = 0, follow_pos_.clear(); what_letter_.clear();
  auto syntax_tree_root = expression_eval(simplified_expr, curr_pos);

  auto comp = [&](int a, int b) -> bool {
    return (what_letter_[a] == what_letter_[b] ? a < b : what_letter_[a] < what_letter_[b]);
  };

  //initialize queue with first_pos of all the syntax tree as a starting state
  queue< vector<int> > que;
  que.push(vector<int>());
  for (int it : syntax_tree_root->first_pos)
    que.front().push_back(it);
  sort(que.front().begin(), que.front().end(), comp);

  mark_.clear();
  int num_states = 0;
  DFA res;
  mark_[que.front()] = ++num_states;
  res.add_node(num_states);
  res.set_initial(num_states);
  delete syntax_tree_root;

  while (!que.empty()) {
    auto curr_state = que.front();
    que.pop();

    //for each state generate a next state based on follow_pos and by choosing
    //subsets of positions with same letter

    int i = 0;
    while (i < (int)curr_state.size()) {
      int j = i;
      vector< int > next;
      while (j < (int)curr_state.size() && what_letter_[curr_state[i]] == what_letter_[curr_state[j]]) {
        for (int it : follow_pos_[curr_state[j]])
          next.push_back(it);
        j++;
      }

      //ignore states generated by the end marker
      if (what_letter_[curr_state[i]] == '#') {
        i = j;
        continue;
      }
      sort(next.begin(), next.end());
      next.erase(unique(next.begin(), next.end()), next.end());
      sort(next.begin(), next.end(), comp);

      //add the new state
      if (!mark_[next]) {
        mark_[next] = ++num_states;
        res.add_node(num_states);
        que.push(next);
      }

      //and the corresponding transition
      res.add_transition(mark_[curr_state], what_letter_[curr_state[i]], mark_[next]);
      i = j;
    }
  }

  for (auto it : mark_)
    for (int state : it.first)
      if (what_letter_[state] == '#') {
        res.add_final(it.second);
        break;
      }

  return res;
}